

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

PathTypeHandlerBase * __thiscall
Js::PathTypeHandlerBase::DeoptimizeObjectHeaderInlining
          (PathTypeHandlerBase *this,JavascriptLibrary *library)

{
  code *pcVar1;
  uchar *setters_00;
  ObjectSlotAttributes *pOVar2;
  PathTypeHandlerWithAttr *this_00;
  ObjectSlotAttributes *typePath;
  bool bVar3;
  PropertyTypes values;
  uint16 uVar4;
  uint16 uVar5;
  PropertyIndex PVar6;
  int iVar7;
  int iVar8;
  undefined4 *puVar9;
  undefined4 extraout_var;
  TypePath *pTVar10;
  PropertyRecord **ppPVar11;
  ScriptContext *pSVar12;
  Recycler *pRVar13;
  undefined4 extraout_var_00;
  TrackAllocData local_c8;
  uchar *local_a0;
  PathTypeSetterSlotIndex *newSetters;
  PathTypeSetterSlotIndex *setters;
  undefined8 local_88;
  TrackAllocData local_80;
  ObjectSlotAttributes *local_58;
  ObjectSlotAttributes *newAttributes;
  PathTypeHandlerWithAttr *pPStack_48;
  uint8 newTypePathSize;
  PathTypeHandlerBase *clonedTypeHandler;
  void *pvStack_38;
  PropertyIndex i;
  ObjectSlotAttributes *attributes;
  TypePath *clonedPath;
  Recycler *pRStack_20;
  uint16 pathLength;
  Recycler *recycler;
  JavascriptLibrary *library_local;
  PathTypeHandlerBase *this_local;
  
  recycler = (Recycler *)library;
  library_local = (JavascriptLibrary *)this;
  bVar3 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(&this->super_DynamicTypeHandler);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xa46,"(IsObjectHeaderInlinedTypeHandler())",
                                "IsObjectHeaderInlinedTypeHandler()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pRStack_20 = JavascriptLibrary::GetRecycler((JavascriptLibrary *)recycler);
  clonedPath._6_2_ = GetPathLength(this);
  attributes = (ObjectSlotAttributes *)TypePath::New(pRStack_20,(uint)clonedPath._6_2_);
  iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
  pvStack_38 = (void *)CONCAT44(extraout_var,iVar7);
  for (clonedTypeHandler._6_2_ = 0; clonedTypeHandler._6_2_ < clonedPath._6_2_;
      clonedTypeHandler._6_2_ = clonedTypeHandler._6_2_ + 1) {
    pTVar10 = GetTypePath(this);
    Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator=
              ((WriteBarrierPtr<const_Js::PropertyRecord> *)
               (attributes + (ulong)clonedTypeHandler._6_2_ * 8 + 0x10),
               (WriteBarrierPtr<const_Js::PropertyRecord> *)
               (&pTVar10[1].data + clonedTypeHandler._6_2_));
    pOVar2 = attributes;
    if ((pvStack_38 == (void *)0x0) ||
       (*(char *)((long)pvStack_38 + (ulong)clonedTypeHandler._6_2_) != -9)) {
      ppPVar11 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__
                           ((WriteBarrierPtr *)
                            (attributes + (ulong)clonedTypeHandler._6_2_ * 8 + 0x10));
      TypePath::AddInternal<true>((TypePath *)pOVar2,*ppPVar11);
    }
    else {
      ppPVar11 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__
                           ((WriteBarrierPtr *)
                            (attributes + (ulong)clonedTypeHandler._6_2_ * 8 + 0x10));
      TypePath::AddInternal<false>((TypePath *)pOVar2,*ppPVar11);
    }
  }
  if (pvStack_38 == (void *)0x0) {
    pSVar12 = JavascriptLibrary::GetScriptContext((JavascriptLibrary *)recycler);
    pOVar2 = attributes;
    uVar4 = GetPathLength(this);
    iVar7 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
    uVar5 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler);
    PVar6 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
    pPStack_48 = (PathTypeHandlerWithAttr *)
                 PathTypeHandlerNoAttr::New
                           (pSVar12,(TypePath *)pOVar2,uVar4,(PropertyIndex)iVar7,uVar5 - PVar6,0x20
                            ,false,false,(DynamicType *)0x0);
  }
  else {
    newAttributes._7_1_ = TypePath::GetPathSize((TypePath *)attributes);
    pRVar13 = pRStack_20;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_80,(type_info *)&ObjectSlotAttributes::typeinfo,0,(ulong)newAttributes._7_1_,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
               ,0xa6e);
    pRVar13 = Memory::Recycler::TrackAllocInfo(pRVar13,&local_80);
    setters = (PathTypeSetterSlotIndex *)Memory::Recycler::AllocLeaf;
    local_88 = 0;
    local_58 = Memory::AllocateArray<Memory::Recycler,Js::ObjectSlotAttributes,false>
                         ((Memory *)pRVar13,(Recycler *)Memory::Recycler::AllocLeaf,0,
                          (ulong)newAttributes._7_1_);
    memcpy(local_58,pvStack_38,(ulong)newAttributes._7_1_);
    iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])();
    pRVar13 = pRStack_20;
    newSetters = (PathTypeSetterSlotIndex *)CONCAT44(extraout_var_00,iVar7);
    if (newSetters == (PathTypeSetterSlotIndex *)0x0) {
      local_a0 = (uchar *)0x0;
    }
    else {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_c8,(type_info *)&unsigned_char::typeinfo,0,(ulong)newAttributes._7_1_,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                 ,0xa79);
      pRVar13 = Memory::Recycler::TrackAllocInfo(pRVar13,&local_c8);
      local_a0 = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                           ((Memory *)pRVar13,(Recycler *)Memory::Recycler::AllocLeaf,0,
                            (ulong)newAttributes._7_1_);
      memcpy(local_a0,newSetters,(ulong)newAttributes._7_1_);
    }
    pSVar12 = JavascriptLibrary::GetScriptContext((JavascriptLibrary *)recycler);
    typePath = attributes;
    pOVar2 = local_58;
    setters_00 = local_a0;
    iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x71])();
    uVar4 = GetPathLength(this);
    iVar8 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
    uVar5 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler);
    PVar6 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
    pPStack_48 = PathTypeHandlerWithAttr::New
                           (pSVar12,(TypePath *)typePath,pOVar2,setters_00,
                            (PathTypeSetterSlotIndex)iVar7,uVar4,(PropertyIndex)iVar8,uVar5 - PVar6,
                            0x20,false,false,(DynamicType *)0x0);
  }
  DynamicTypeHandler::SetMayBecomeShared((DynamicTypeHandler *)pPStack_48);
  this_00 = pPStack_48;
  values = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::CopyPropertyTypes((DynamicTypeHandler *)this_00,0xb0,values);
  return (PathTypeHandlerBase *)pPStack_48;
}

Assistant:

PathTypeHandlerBase *PathTypeHandlerBase::DeoptimizeObjectHeaderInlining(JavascriptLibrary *const library)
    {
        Assert(IsObjectHeaderInlinedTypeHandler());

        // Clone the type Path here to evolve separately
        Recycler * recycler = library->GetRecycler();
        uint16 pathLength = GetPathLength();
        TypePath * clonedPath = TypePath::New(recycler, pathLength);

        ObjectSlotAttributes *attributes = this->GetAttributeArray();
        for (PropertyIndex i = 0; i < pathLength; i++)
        {
            clonedPath->assignments[i] = GetTypePath()->assignments[i];
            if (attributes && attributes[i] == ObjectSlotAttr_Setter)
            {
                clonedPath->AddInternal<false>(clonedPath->assignments[i]);
            }
            else
            {
                clonedPath->AddInternal<true>(clonedPath->assignments[i]);
            }
        }

        // We don't copy the fixed fields, as we will be sharing this type anyways later and the fixed fields vector has to be invalidated.
        PathTypeHandlerBase * clonedTypeHandler;
        if (attributes == nullptr)
        {
            clonedTypeHandler =
                PathTypeHandlerNoAttr::New(
                    library->GetScriptContext(),
                    clonedPath,
                    GetPathLength(),
                    static_cast<PropertyIndex>(GetSlotCapacity()),
                    GetInlineSlotCapacity() - GetObjectHeaderInlinableSlotCapacity(),
                    sizeof(DynamicObject),
                    false,
                    false);
        }
        else
        {
            uint8 newTypePathSize = clonedPath->GetPathSize();

            ObjectSlotAttributes * newAttributes = RecyclerNewArrayLeaf(recycler, ObjectSlotAttributes, newTypePathSize);
            memcpy(newAttributes, attributes, sizeof(ObjectSlotAttributes) * newTypePathSize);

            PathTypeSetterSlotIndex * setters = GetSetterSlots();
            PathTypeSetterSlotIndex * newSetters;
            if (setters == nullptr)
            {
                newSetters = nullptr;
            }
            else
            {
                newSetters = RecyclerNewArrayLeaf(recycler, PathTypeSetterSlotIndex, newTypePathSize);
                memcpy(newSetters, setters, sizeof(PathTypeSetterSlotIndex) * newTypePathSize);
            }

            clonedTypeHandler =
                PathTypeHandlerWithAttr::New(
                    library->GetScriptContext(),
                    clonedPath,
                    newAttributes,
                    newSetters,
                    GetSetterCount(),
                    GetPathLength(),
                    static_cast<PropertyIndex>(GetSlotCapacity()),
                    GetInlineSlotCapacity() - GetObjectHeaderInlinableSlotCapacity(),
                    sizeof(DynamicObject),
                    false,
                    false);
        }
        clonedTypeHandler->SetMayBecomeShared();
        clonedTypeHandler->CopyPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());

        return clonedTypeHandler;
    }